

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O0

void __thiscall duckdb::PhysicalRecursiveCTE::~PhysicalRecursiveCTE(PhysicalRecursiveCTE *this)

{
  PhysicalOperator *in_RDI;
  
  in_RDI->_vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalRecursiveCTE_03531de8;
  vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_true>
             *)0x18c3a4d);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x18c3a5e);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x18c3a6f);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x18c3a80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x18c3a91);
  shared_ptr<duckdb::ColumnDataCollection,_true>::~shared_ptr
            ((shared_ptr<duckdb::ColumnDataCollection,_true> *)0x18c3aa2);
  shared_ptr<duckdb::MetaPipeline,_true>::~shared_ptr
            ((shared_ptr<duckdb::MetaPipeline,_true> *)0x18c3ab3);
  shared_ptr<duckdb::ColumnDataCollection,_true>::~shared_ptr
            ((shared_ptr<duckdb::ColumnDataCollection,_true> *)0x18c3ac4);
  ::std::__cxx11::string::~string((string *)(in_RDI + 1));
  PhysicalOperator::~PhysicalOperator(in_RDI);
  return;
}

Assistant:

PhysicalRecursiveCTE::~PhysicalRecursiveCTE() {
}